

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O0

void __thiscall
slang::ast::BinaryExpression::serializeTo(BinaryExpression *this,ASTSerializer *serializer)

{
  Expression *pEVar1;
  ASTSerializer *in_RSI;
  BinaryExpression *in_RDI;
  string_view sVar2;
  char *in_stack_ffffffffffffff98;
  ASTSerializer *this_00;
  undefined4 local_50;
  undefined8 local_48;
  undefined4 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined4 local_20;
  undefined8 local_18;
  
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_RDI,in_stack_ffffffffffffff98);
  sVar2 = ast::toString(Add);
  local_30 = sVar2._M_len;
  ASTSerializer::write(in_RSI,local_20,local_18,local_30);
  this_00 = in_RSI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_RDI,(char *)in_RSI);
  pEVar1 = left(in_RDI);
  ASTSerializer::write(this_00,local_40,local_38,(size_t)pEVar1);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_RDI,(char *)this_00);
  pEVar1 = right(in_RDI);
  ASTSerializer::write(in_RSI,local_50,local_48,(size_t)pEVar1);
  return;
}

Assistant:

void BinaryExpression::serializeTo(ASTSerializer& serializer) const {
    serializer.write("op", toString(op));
    serializer.write("left", left());
    serializer.write("right", right());
}